

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# multipartExamples.cpp
# Opt level: O0

void modifyMultipart(void)

{
  undefined4 uVar1;
  __type _Var2;
  int iVar3;
  int iVar4;
  Header *pHVar5;
  reference this;
  size_type sVar6;
  list<Imf_3_4::Array2D<float>,_std::allocator<Imf_3_4::Array2D<float>_>_> *floatChannels_00;
  long lVar7;
  DeepTiledOutputPart outputPart_3;
  DeepScanLineOutputPart outputPart_2;
  Box2i dataWindow_1;
  DeepTiledInputPart inputPart_3;
  DeepScanLineInputPart inputPart_2;
  DeepFrameBuffer frameBuffer_1;
  list<Imf_3_4::Array2D<float_*>,_std::allocator<Imf_3_4::Array2D<float_*>_>_> floatChannels_1;
  list<Imf_3_4::Array2D<Imath_3_2::half_*>,_std::allocator<Imf_3_4::Array2D<Imath_3_2::half_*>_>_>
  halfChannels_1;
  list<Imf_3_4::Array2D<unsigned_int_*>,_std::allocator<Imf_3_4::Array2D<unsigned_int_*>_>_>
  intChannels_1;
  Array2D<unsigned_int> sampleCount;
  TiledOutputPart outputPart_1;
  OutputPart outputPart;
  Box2i dataWindow;
  TiledInputPart inputPart_1;
  InputPart inputPart;
  FrameBuffer frameBuffer;
  list<Imf_3_4::Array2D<float>,_std::allocator<Imf_3_4::Array2D<float>_>_> floatChannels;
  list<Imf_3_4::Array2D<Imath_3_2::half>,_std::allocator<Imf_3_4::Array2D<Imath_3_2::half>_>_>
  halfChannels;
  list<Imf_3_4::Array2D<unsigned_int>,_std::allocator<Imf_3_4::Array2D<unsigned_int>_>_> intChannels
  ;
  string *type;
  Header *header;
  int i_1;
  MultiPartOutputFile outputFile;
  int i;
  vector<Imf_3_4::Header,_std::allocator<Imf_3_4::Header>_> headers;
  MultiPartInputFile inputFile;
  undefined4 in_stack_fffffffffffffcb8;
  float in_stack_fffffffffffffcbc;
  int in_stack_fffffffffffffcc0;
  int in_stack_fffffffffffffcc4;
  undefined4 in_stack_fffffffffffffcd0;
  int in_stack_fffffffffffffcd4;
  int in_stack_fffffffffffffcd8;
  int in_stack_fffffffffffffcdc;
  int in_stack_fffffffffffffce0;
  int in_stack_fffffffffffffce4;
  list<Imf_3_4::Array2D<Imath_3_2::half_*>,_std::allocator<Imf_3_4::Array2D<Imath_3_2::half_*>_>_>
  *in_stack_fffffffffffffcf0;
  list<Imf_3_4::Array2D<Imath_3_2::half>,_std::allocator<Imf_3_4::Array2D<Imath_3_2::half>_>_>
  *in_stack_fffffffffffffcf8;
  undefined4 in_stack_fffffffffffffd00;
  undefined2 in_stack_fffffffffffffd04;
  half in_stack_fffffffffffffd06;
  Array2D<unsigned_int> *in_stack_fffffffffffffd08;
  Array2D<unsigned_int> *in_stack_fffffffffffffd10;
  list<Imf_3_4::Array2D<unsigned_int>,_std::allocator<Imf_3_4::Array2D<unsigned_int>_>_>
  *intChannels_00;
  DeepTiledOutputPart local_228 [8];
  DeepScanLineOutputPart local_220 [8];
  _Base_ptr in_stack_fffffffffffffde8;
  _Base_ptr in_stack_fffffffffffffdf0;
  _Base_ptr in_stack_fffffffffffffdf8;
  _Base_ptr in_stack_fffffffffffffe00;
  Header *in_stack_fffffffffffffe08;
  Array2D<unsigned_int> local_140;
  undefined1 local_128 [8];
  undefined1 local_120 [32];
  undefined1 local_100 [8];
  FrameBuffer local_f8 [2];
  list<Imf_3_4::Array2D<float>,_std::allocator<Imf_3_4::Array2D<float>_>_> *local_78;
  reference local_70;
  int local_64;
  MultiPartOutputFile local_60 [20];
  int local_4c;
  list<Imf_3_4::Array2D<unsigned_int>,_std::allocator<Imf_3_4::Array2D<unsigned_int>_>_> local_38;
  MultiPartInputFile local_20 [32];
  
  iVar3 = Imf_3_4::globalThreadCount();
  Imf_3_4::MultiPartInputFile::MultiPartInputFile(local_20,"multipart.exr",iVar3,true);
  Imf_3_4::MultiPartInputFile::parts();
  std::allocator<Imf_3_4::Header>::allocator((allocator<Imf_3_4::Header> *)0x117c6b);
  std::vector<Imf_3_4::Header,_std::allocator<Imf_3_4::Header>_>::vector
            ((vector<Imf_3_4::Header,_std::allocator<Imf_3_4::Header>_> *)
             CONCAT44(in_stack_fffffffffffffce4,in_stack_fffffffffffffce0),
             CONCAT44(in_stack_fffffffffffffcdc,in_stack_fffffffffffffcd8),
             (allocator_type *)CONCAT44(in_stack_fffffffffffffcd4,in_stack_fffffffffffffcd0));
  std::allocator<Imf_3_4::Header>::~allocator((allocator<Imf_3_4::Header> *)0x117c97);
  for (local_4c = 0; iVar3 = local_4c, iVar4 = Imf_3_4::MultiPartInputFile::parts(), iVar3 < iVar4;
      local_4c = local_4c + 1) {
    pHVar5 = (Header *)Imf_3_4::MultiPartInputFile::header((int)local_20);
    this = std::vector<Imf_3_4::Header,_std::allocator<Imf_3_4::Header>_>::operator[]
                     ((vector<Imf_3_4::Header,_std::allocator<Imf_3_4::Header>_> *)&local_38,
                      (long)local_4c);
    Imf_3_4::Header::operator=(this,pHVar5);
  }
  intChannels_00 = &local_38;
  pHVar5 = std::vector<Imf_3_4::Header,_std::allocator<Imf_3_4::Header>_>::data
                     ((vector<Imf_3_4::Header,_std::allocator<Imf_3_4::Header>_> *)0x117da6);
  sVar6 = std::vector<Imf_3_4::Header,_std::allocator<Imf_3_4::Header>_>::size
                    ((vector<Imf_3_4::Header,_std::allocator<Imf_3_4::Header>_> *)intChannels_00);
  iVar3 = Imf_3_4::globalThreadCount();
  Imf_3_4::MultiPartOutputFile::MultiPartOutputFile
            (local_60,"modified.exr",pHVar5,(int)sVar6,false,iVar3);
  local_64 = 0;
  while (iVar3 = local_64, iVar4 = Imf_3_4::MultiPartInputFile::parts(), iVar3 < iVar4) {
    local_70 = std::vector<Imf_3_4::Header,_std::allocator<Imf_3_4::Header>_>::operator[]
                         ((vector<Imf_3_4::Header,_std::allocator<Imf_3_4::Header>_> *)&local_38,
                          (long)local_64);
    floatChannels_00 =
         (list<Imf_3_4::Array2D<float>,_std::allocator<Imf_3_4::Array2D<float>_>_> *)
         Imf_3_4::Header::type_abi_cxx11_();
    local_78 = floatChannels_00;
    _Var2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            CONCAT44(in_stack_fffffffffffffce4,in_stack_fffffffffffffce0),
                            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            CONCAT44(in_stack_fffffffffffffcdc,in_stack_fffffffffffffcd8));
    if ((_Var2) ||
       (_Var2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )CONCAT44(in_stack_fffffffffffffce4,in_stack_fffffffffffffce0),
                                (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )CONCAT44(in_stack_fffffffffffffcdc,in_stack_fffffffffffffcd8)),
       _Var2)) {
      std::__cxx11::
      list<Imf_3_4::Array2D<unsigned_int>,_std::allocator<Imf_3_4::Array2D<unsigned_int>_>_>::list
                ((list<Imf_3_4::Array2D<unsigned_int>,_std::allocator<Imf_3_4::Array2D<unsigned_int>_>_>
                  *)0x117ed3);
      std::__cxx11::
      list<Imf_3_4::Array2D<Imath_3_2::half>,_std::allocator<Imf_3_4::Array2D<Imath_3_2::half>_>_>::
      list((list<Imf_3_4::Array2D<Imath_3_2::half>,_std::allocator<Imf_3_4::Array2D<Imath_3_2::half>_>_>
            *)0x117ee8);
      std::__cxx11::list<Imf_3_4::Array2D<float>,_std::allocator<Imf_3_4::Array2D<float>_>_>::list
                ((list<Imf_3_4::Array2D<float>,_std::allocator<Imf_3_4::Array2D<float>_>_> *)
                 0x117efd);
      setupFramebuffer(pHVar5,intChannels_00,
                       (list<Imf_3_4::Array2D<Imath_3_2::half>,_std::allocator<Imf_3_4::Array2D<Imath_3_2::half>_>_>
                        *)CONCAT44(iVar4,iVar3),floatChannels_00);
      _Var2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              CONCAT44(in_stack_fffffffffffffce4,in_stack_fffffffffffffce0),
                              (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              CONCAT44(in_stack_fffffffffffffcdc,in_stack_fffffffffffffcd8));
      if (_Var2) {
        Imf_3_4::InputPart::InputPart((InputPart *)local_f8,local_20,local_64);
        Imf_3_4::InputPart::setFrameBuffer(local_f8);
        lVar7 = Imf_3_4::Header::dataWindow();
        iVar3 = *(int *)(lVar7 + 4);
        Imf_3_4::Header::dataWindow();
        Imf_3_4::InputPart::readPixels((int)local_f8,iVar3);
      }
      else {
        Imf_3_4::TiledInputPart::TiledInputPart((TiledInputPart *)local_100,local_20,local_64);
        Imf_3_4::TiledInputPart::setFrameBuffer((FrameBuffer *)local_100);
        iVar3 = Imf_3_4::TiledInputPart::numXTiles((int)local_100);
        iVar4 = Imf_3_4::TiledInputPart::numYTiles((int)local_100);
        Imf_3_4::TiledInputPart::readTiles((int)local_100,0,iVar3 + -1,0,iVar4 + -1);
      }
      modifyChannels<unsigned_int>
                ((list<Imf_3_4::Array2D<unsigned_int>,_std::allocator<Imf_3_4::Array2D<unsigned_int>_>_>
                  *)CONCAT26(in_stack_fffffffffffffd06._h,
                             CONCAT24(in_stack_fffffffffffffd04,in_stack_fffffffffffffd00)),
                 (uint)((ulong)in_stack_fffffffffffffcf8 >> 0x20));
      Imath_3_2::half::half
                ((half *)CONCAT44(in_stack_fffffffffffffcc4,in_stack_fffffffffffffcc0),
                 in_stack_fffffffffffffcbc);
      modifyChannels<Imath_3_2::half>(in_stack_fffffffffffffcf8,in_stack_fffffffffffffd06);
      modifyChannels<float>
                ((list<Imf_3_4::Array2D<float>,_std::allocator<Imf_3_4::Array2D<float>_>_> *)
                 CONCAT26(in_stack_fffffffffffffd06._h,
                          CONCAT24(in_stack_fffffffffffffd04,in_stack_fffffffffffffd00)),
                 (float)((ulong)in_stack_fffffffffffffcf8 >> 0x20));
      _Var2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              CONCAT44(in_stack_fffffffffffffce4,in_stack_fffffffffffffce0),
                              (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              CONCAT44(in_stack_fffffffffffffcdc,in_stack_fffffffffffffcd8));
      if (_Var2) {
        Imf_3_4::Header::dataWindow();
        Imath_3_2::Box<Imath_3_2::Vec2<int>_>::Box
                  ((Box<Imath_3_2::Vec2<int>_> *)
                   CONCAT44(in_stack_fffffffffffffcc4,in_stack_fffffffffffffcc0),
                   (Box<Imath_3_2::Vec2<int>_> *)
                   CONCAT44(in_stack_fffffffffffffcbc,in_stack_fffffffffffffcb8));
        Imf_3_4::OutputPart::OutputPart((OutputPart *)local_120,local_60,local_64);
        Imf_3_4::OutputPart::setFrameBuffer((FrameBuffer *)local_120);
        Imf_3_4::OutputPart::writePixels((int)local_120);
      }
      else {
        Imf_3_4::TiledOutputPart::TiledOutputPart((TiledOutputPart *)local_128,local_60,local_64);
        Imf_3_4::TiledOutputPart::setFrameBuffer((FrameBuffer *)local_128);
        iVar3 = Imf_3_4::TiledOutputPart::numXTiles((int)local_128);
        iVar4 = Imf_3_4::TiledOutputPart::numYTiles((int)local_128);
        Imf_3_4::TiledOutputPart::writeTiles((int)local_128,0,iVar3 + -1,0,iVar4 + -1);
      }
      Imf_3_4::FrameBuffer::~FrameBuffer((FrameBuffer *)0x118280);
      std::__cxx11::list<Imf_3_4::Array2D<float>,_std::allocator<Imf_3_4::Array2D<float>_>_>::~list
                ((list<Imf_3_4::Array2D<float>,_std::allocator<Imf_3_4::Array2D<float>_>_> *)
                 0x11828d);
      std::__cxx11::
      list<Imf_3_4::Array2D<Imath_3_2::half>,_std::allocator<Imf_3_4::Array2D<Imath_3_2::half>_>_>::
      ~list((list<Imf_3_4::Array2D<Imath_3_2::half>,_std::allocator<Imf_3_4::Array2D<Imath_3_2::half>_>_>
             *)0x11829a);
      std::__cxx11::
      list<Imf_3_4::Array2D<unsigned_int>,_std::allocator<Imf_3_4::Array2D<unsigned_int>_>_>::~list
                ((list<Imf_3_4::Array2D<unsigned_int>,_std::allocator<Imf_3_4::Array2D<unsigned_int>_>_>
                  *)0x1182a7);
    }
    else {
      _Var2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              CONCAT44(in_stack_fffffffffffffce4,in_stack_fffffffffffffce0),
                              (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              CONCAT44(in_stack_fffffffffffffcdc,in_stack_fffffffffffffcd8));
      if ((_Var2) ||
         (_Var2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)CONCAT44(in_stack_fffffffffffffce4,in_stack_fffffffffffffce0),
                                  (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)CONCAT44(in_stack_fffffffffffffcdc,in_stack_fffffffffffffcd8)),
         _Var2)) {
        Imf_3_4::Array2D<unsigned_int>::Array2D(&local_140);
        std::__cxx11::
        list<Imf_3_4::Array2D<unsigned_int_*>,_std::allocator<Imf_3_4::Array2D<unsigned_int_*>_>_>::
        list((list<Imf_3_4::Array2D<unsigned_int_*>,_std::allocator<Imf_3_4::Array2D<unsigned_int_*>_>_>
              *)0x11832e);
        std::__cxx11::
        list<Imf_3_4::Array2D<Imath_3_2::half_*>,_std::allocator<Imf_3_4::Array2D<Imath_3_2::half_*>_>_>
        ::list((list<Imf_3_4::Array2D<Imath_3_2::half_*>,_std::allocator<Imf_3_4::Array2D<Imath_3_2::half_*>_>_>
                *)0x118340);
        std::__cxx11::list<Imf_3_4::Array2D<float_*>,_std::allocator<Imf_3_4::Array2D<float_*>_>_>::
        list((list<Imf_3_4::Array2D<float_*>,_std::allocator<Imf_3_4::Array2D<float_*>_>_> *)
             0x118352);
        setupDeepFramebuffer
                  (in_stack_fffffffffffffe08,(Array2D<unsigned_int> *)in_stack_fffffffffffffe00,
                   (list<Imf_3_4::Array2D<unsigned_int_*>,_std::allocator<Imf_3_4::Array2D<unsigned_int_*>_>_>
                    *)in_stack_fffffffffffffdf8,
                   (list<Imf_3_4::Array2D<Imath_3_2::half_*>,_std::allocator<Imf_3_4::Array2D<Imath_3_2::half_*>_>_>
                    *)in_stack_fffffffffffffdf0,
                   (list<Imf_3_4::Array2D<float_*>,_std::allocator<Imf_3_4::Array2D<float_*>_>_> *)
                   in_stack_fffffffffffffde8);
        _Var2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )CONCAT44(in_stack_fffffffffffffce4,in_stack_fffffffffffffce0),
                                (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )CONCAT44(in_stack_fffffffffffffcdc,in_stack_fffffffffffffcd8));
        if (_Var2) {
          Imf_3_4::DeepScanLineInputPart::DeepScanLineInputPart
                    ((DeepScanLineInputPart *)&stack0xfffffffffffffe08,local_20,local_64);
          Imf_3_4::DeepScanLineInputPart::setFrameBuffer
                    ((DeepFrameBuffer *)&stack0xfffffffffffffe08);
          in_stack_fffffffffffffd10 = (Array2D<unsigned_int> *)Imf_3_4::Header::dataWindow();
          uVar1 = *(undefined4 *)((long)&in_stack_fffffffffffffd10->_sizeX + 4);
          in_stack_fffffffffffffd04 = (undefined2)uVar1;
          in_stack_fffffffffffffd06._h = (uint16_t)((uint)uVar1 >> 0x10);
          in_stack_fffffffffffffd08 = (Array2D<unsigned_int> *)Imf_3_4::Header::dataWindow();
          Imf_3_4::DeepScanLineInputPart::readPixelSampleCounts
                    ((int)&stack0xfffffffffffffe08,
                     CONCAT22(in_stack_fffffffffffffd06._h,in_stack_fffffffffffffd04));
          resizeDeepBuffers<unsigned_int>
                    ((Array2D<unsigned_int> *)
                     CONCAT26(in_stack_fffffffffffffd06._h,
                              CONCAT24(in_stack_fffffffffffffd04,in_stack_fffffffffffffd00)),
                     (list<Imf_3_4::Array2D<unsigned_int_*>,_std::allocator<Imf_3_4::Array2D<unsigned_int_*>_>_>
                      *)in_stack_fffffffffffffcf8);
          resizeDeepBuffers<Imath_3_2::half>
                    ((Array2D<unsigned_int> *)
                     CONCAT26(in_stack_fffffffffffffd06._h,
                              CONCAT24(in_stack_fffffffffffffd04,in_stack_fffffffffffffd00)),
                     (list<Imf_3_4::Array2D<Imath_3_2::half_*>,_std::allocator<Imf_3_4::Array2D<Imath_3_2::half_*>_>_>
                      *)in_stack_fffffffffffffcf8);
          resizeDeepBuffers<float>
                    ((Array2D<unsigned_int> *)
                     CONCAT26(in_stack_fffffffffffffd06._h,
                              CONCAT24(in_stack_fffffffffffffd04,in_stack_fffffffffffffd00)),
                     (list<Imf_3_4::Array2D<float_*>,_std::allocator<Imf_3_4::Array2D<float_*>_>_> *
                     )in_stack_fffffffffffffcf8);
          in_stack_fffffffffffffcf8 =
               (list<Imf_3_4::Array2D<Imath_3_2::half>,_std::allocator<Imf_3_4::Array2D<Imath_3_2::half>_>_>
                *)Imf_3_4::Header::dataWindow();
          iVar3 = *(int *)((long)&(in_stack_fffffffffffffcf8->
                                  super__List_base<Imf_3_4::Array2D<Imath_3_2::half>,_std::allocator<Imf_3_4::Array2D<Imath_3_2::half>_>_>
                                  )._M_impl._M_node.super__List_node_base._M_next + 4);
          in_stack_fffffffffffffcf0 =
               (list<Imf_3_4::Array2D<Imath_3_2::half_*>,_std::allocator<Imf_3_4::Array2D<Imath_3_2::half_*>_>_>
                *)Imf_3_4::Header::dataWindow();
          Imf_3_4::DeepScanLineInputPart::readPixels((int)&stack0xfffffffffffffe08,iVar3);
        }
        else {
          Imf_3_4::DeepTiledInputPart::DeepTiledInputPart
                    ((DeepTiledInputPart *)&stack0xfffffffffffffe00,local_20,local_64);
          Imf_3_4::DeepTiledInputPart::setFrameBuffer((DeepFrameBuffer *)&stack0xfffffffffffffe00);
          in_stack_fffffffffffffce0 =
               Imf_3_4::DeepTiledInputPart::numXTiles((int)&stack0xfffffffffffffe00);
          in_stack_fffffffffffffce0 = in_stack_fffffffffffffce0 + -1;
          in_stack_fffffffffffffce4 =
               Imf_3_4::DeepTiledInputPart::numYTiles((int)&stack0xfffffffffffffe00);
          Imf_3_4::DeepTiledInputPart::readPixelSampleCounts
                    ((int)&stack0xfffffffffffffe00,0,in_stack_fffffffffffffce0,0,
                     in_stack_fffffffffffffce4 + -1);
          resizeDeepBuffers<unsigned_int>
                    ((Array2D<unsigned_int> *)
                     CONCAT26(in_stack_fffffffffffffd06._h,
                              CONCAT24(in_stack_fffffffffffffd04,in_stack_fffffffffffffd00)),
                     (list<Imf_3_4::Array2D<unsigned_int_*>,_std::allocator<Imf_3_4::Array2D<unsigned_int_*>_>_>
                      *)in_stack_fffffffffffffcf8);
          resizeDeepBuffers<Imath_3_2::half>
                    ((Array2D<unsigned_int> *)
                     CONCAT26(in_stack_fffffffffffffd06._h,
                              CONCAT24(in_stack_fffffffffffffd04,in_stack_fffffffffffffd00)),
                     (list<Imf_3_4::Array2D<Imath_3_2::half_*>,_std::allocator<Imf_3_4::Array2D<Imath_3_2::half_*>_>_>
                      *)in_stack_fffffffffffffcf8);
          resizeDeepBuffers<float>
                    ((Array2D<unsigned_int> *)
                     CONCAT26(in_stack_fffffffffffffd06._h,
                              CONCAT24(in_stack_fffffffffffffd04,in_stack_fffffffffffffd00)),
                     (list<Imf_3_4::Array2D<float_*>,_std::allocator<Imf_3_4::Array2D<float_*>_>_> *
                     )in_stack_fffffffffffffcf8);
          in_stack_fffffffffffffcdc =
               Imf_3_4::DeepTiledInputPart::numXTiles((int)&stack0xfffffffffffffe00);
          in_stack_fffffffffffffcd4 = in_stack_fffffffffffffcdc + -1;
          in_stack_fffffffffffffcd8 =
               Imf_3_4::DeepTiledInputPart::numYTiles((int)&stack0xfffffffffffffe00);
          Imf_3_4::DeepTiledInputPart::readTiles
                    ((int)&stack0xfffffffffffffe00,0,in_stack_fffffffffffffcd4,0,
                     in_stack_fffffffffffffcd8 + -1);
        }
        modifyDeepChannels<unsigned_int>
                  (in_stack_fffffffffffffd10,
                   (list<Imf_3_4::Array2D<unsigned_int_*>,_std::allocator<Imf_3_4::Array2D<unsigned_int_*>_>_>
                    *)in_stack_fffffffffffffd08,
                   CONCAT22(in_stack_fffffffffffffd06._h,in_stack_fffffffffffffd04));
        Imath_3_2::half::half
                  ((half *)CONCAT44(in_stack_fffffffffffffcc4,in_stack_fffffffffffffcc0),
                   in_stack_fffffffffffffcbc);
        modifyDeepChannels<Imath_3_2::half>
                  (in_stack_fffffffffffffd08,
                   (list<Imf_3_4::Array2D<Imath_3_2::half_*>,_std::allocator<Imf_3_4::Array2D<Imath_3_2::half_*>_>_>
                    *)CONCAT26(in_stack_fffffffffffffd06._h,
                               CONCAT24(in_stack_fffffffffffffd04,in_stack_fffffffffffffd00)),
                   (half)(uint16_t)((ulong)in_stack_fffffffffffffd10 >> 0x30));
        modifyDeepChannels<float>
                  (in_stack_fffffffffffffd10,
                   (list<Imf_3_4::Array2D<float_*>,_std::allocator<Imf_3_4::Array2D<float_*>_>_> *)
                   in_stack_fffffffffffffd08,
                   (float)CONCAT22(in_stack_fffffffffffffd06._h,in_stack_fffffffffffffd04));
        _Var2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )CONCAT44(in_stack_fffffffffffffce4,in_stack_fffffffffffffce0),
                                (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )CONCAT44(in_stack_fffffffffffffcdc,in_stack_fffffffffffffcd8));
        if (_Var2) {
          Imf_3_4::Header::dataWindow();
          Imath_3_2::Box<Imath_3_2::Vec2<int>_>::Box
                    ((Box<Imath_3_2::Vec2<int>_> *)
                     CONCAT44(in_stack_fffffffffffffcc4,in_stack_fffffffffffffcc0),
                     (Box<Imath_3_2::Vec2<int>_> *)
                     CONCAT44(in_stack_fffffffffffffcbc,in_stack_fffffffffffffcb8));
          Imf_3_4::DeepScanLineOutputPart::DeepScanLineOutputPart(local_220,local_60,local_64);
          Imf_3_4::DeepScanLineOutputPart::setFrameBuffer((DeepFrameBuffer *)local_220);
          Imf_3_4::DeepScanLineOutputPart::writePixels((int)local_220);
        }
        else {
          Imf_3_4::DeepTiledOutputPart::DeepTiledOutputPart(local_228,local_60,local_64);
          Imf_3_4::DeepTiledOutputPart::setFrameBuffer((DeepFrameBuffer *)local_228);
          in_stack_fffffffffffffcc4 = Imf_3_4::DeepTiledOutputPart::numXTiles((int)local_228);
          in_stack_fffffffffffffcbc = (float)(in_stack_fffffffffffffcc4 + -1);
          in_stack_fffffffffffffcc0 = Imf_3_4::DeepTiledOutputPart::numYTiles((int)local_228);
          Imf_3_4::DeepTiledOutputPart::writeTiles
                    ((int)local_228,0,(int)in_stack_fffffffffffffcbc,0,
                     in_stack_fffffffffffffcc0 + -1);
        }
        freeDeepBuffers<unsigned_int>
                  ((list<Imf_3_4::Array2D<unsigned_int_*>,_std::allocator<Imf_3_4::Array2D<unsigned_int_*>_>_>
                    *)in_stack_fffffffffffffcf0);
        freeDeepBuffers<Imath_3_2::half>(in_stack_fffffffffffffcf0);
        freeDeepBuffers<float>
                  ((list<Imf_3_4::Array2D<float_*>,_std::allocator<Imf_3_4::Array2D<float_*>_>_> *)
                   in_stack_fffffffffffffcf0);
        Imf_3_4::DeepFrameBuffer::~DeepFrameBuffer((DeepFrameBuffer *)0x1187fb);
        std::__cxx11::list<Imf_3_4::Array2D<float_*>,_std::allocator<Imf_3_4::Array2D<float_*>_>_>::
        ~list((list<Imf_3_4::Array2D<float_*>,_std::allocator<Imf_3_4::Array2D<float_*>_>_> *)
              0x118808);
        std::__cxx11::
        list<Imf_3_4::Array2D<Imath_3_2::half_*>,_std::allocator<Imf_3_4::Array2D<Imath_3_2::half_*>_>_>
        ::~list((list<Imf_3_4::Array2D<Imath_3_2::half_*>,_std::allocator<Imf_3_4::Array2D<Imath_3_2::half_*>_>_>
                 *)0x118815);
        std::__cxx11::
        list<Imf_3_4::Array2D<unsigned_int_*>,_std::allocator<Imf_3_4::Array2D<unsigned_int_*>_>_>::
        ~list((list<Imf_3_4::Array2D<unsigned_int_*>,_std::allocator<Imf_3_4::Array2D<unsigned_int_*>_>_>
               *)0x118822);
        Imf_3_4::Array2D<unsigned_int>::~Array2D
                  ((Array2D<unsigned_int> *)
                   CONCAT44(in_stack_fffffffffffffcc4,in_stack_fffffffffffffcc0));
      }
    }
    local_64 = local_64 + 1;
  }
  Imf_3_4::MultiPartOutputFile::~MultiPartOutputFile(local_60);
  std::vector<Imf_3_4::Header,_std::allocator<Imf_3_4::Header>_>::~vector
            ((vector<Imf_3_4::Header,_std::allocator<Imf_3_4::Header>_> *)
             CONCAT44(in_stack_fffffffffffffcd4,in_stack_fffffffffffffcd0));
  Imf_3_4::MultiPartInputFile::~MultiPartInputFile
            ((MultiPartInputFile *)CONCAT44(in_stack_fffffffffffffcc4,in_stack_fffffffffffffcc0));
  return;
}

Assistant:

void
modifyMultipart ()
{
    //
    // Read all channels from a multi-part file, modify each pixel value, write the modified data as a multi-part file.
    // The parts in the file can be scanline- or tile-based, either flat or deep.
    // Every channel of the input file gets modified.
    //

    MultiPartInputFile inputFile ("multipart.exr");

    std::vector<Header> headers (inputFile.parts ());

    for (int i = 0; i < inputFile.parts (); i++)
    {
        headers[i] = inputFile.header (i);
    }

    MultiPartOutputFile outputFile (
        "modified.exr", headers.data (), (int) headers.size ());

    for (int i = 0; i < inputFile.parts (); i++)
    {
        Header& header = headers[i];

        const string& type = header.type ();

        if (type == SCANLINEIMAGE || type == TILEDIMAGE)
        {
            list<Array2D<uint32_t>> intChannels;
            list<Array2D<half>>     halfChannels;
            list<Array2D<float>>    floatChannels;

            FrameBuffer frameBuffer = setupFramebuffer (
                header, intChannels, halfChannels, floatChannels);

            if (type == SCANLINEIMAGE)
            {
                InputPart inputPart (inputFile, i);
                inputPart.setFrameBuffer (frameBuffer);
                inputPart.readPixels (
                    header.dataWindow ().min.y, header.dataWindow ().max.y);
            }
            else
            {
                TiledInputPart inputPart (inputFile, i);
                inputPart.setFrameBuffer (frameBuffer);
                inputPart.readTiles (
                    0,
                    inputPart.numXTiles () - 1,
                    0,
                    inputPart.numYTiles () - 1);
            }

            modifyChannels<uint32_t> (intChannels, 1);
            modifyChannels<half> (halfChannels, 0.3);
            modifyChannels<float> (floatChannels, 0.5);

            if (type == SCANLINEIMAGE)
            {
                Box2i      dataWindow = header.dataWindow ();
                OutputPart outputPart (outputFile, i);
                outputPart.setFrameBuffer (frameBuffer);
                outputPart.writePixels (
                    dataWindow.max.y - dataWindow.min.y + 1);
            }
            else
            {
                TiledOutputPart outputPart (outputFile, i);
                outputPart.setFrameBuffer (frameBuffer);
                outputPart.writeTiles (
                    0,
                    outputPart.numXTiles () - 1,
                    0,
                    outputPart.numYTiles () - 1);
            }
        }
        else if (type == DEEPSCANLINE || type == DEEPTILE)
        {
            Array2D<uint32_t>        sampleCount;
            list<Array2D<uint32_t*>> intChannels;
            list<Array2D<half*>>     halfChannels;
            list<Array2D<float*>>    floatChannels;

            DeepFrameBuffer frameBuffer = setupDeepFramebuffer (
                header, sampleCount, intChannels, halfChannels, floatChannels);

            if (type == DEEPSCANLINE)
            {
                DeepScanLineInputPart inputPart (inputFile, i);
                inputPart.setFrameBuffer (frameBuffer);
                inputPart.readPixelSampleCounts (
                    header.dataWindow ().min.y, header.dataWindow ().max.y);

                resizeDeepBuffers<uint32_t> (sampleCount, intChannels);
                resizeDeepBuffers<half> (sampleCount, halfChannels);
                resizeDeepBuffers<float> (sampleCount, floatChannels);

                inputPart.readPixels (
                    header.dataWindow ().min.y, header.dataWindow ().max.y);
            }
            else
            {
                DeepTiledInputPart inputPart (inputFile, i);
                inputPart.setFrameBuffer (frameBuffer);
                inputPart.readPixelSampleCounts (
                    0,
                    inputPart.numXTiles () - 1,
                    0,
                    inputPart.numYTiles () - 1);

                resizeDeepBuffers<uint32_t> (sampleCount, intChannels);
                resizeDeepBuffers<half> (sampleCount, halfChannels);
                resizeDeepBuffers<float> (sampleCount, floatChannels);

                inputPart.readTiles (
                    0,
                    inputPart.numXTiles () - 1,
                    0,
                    inputPart.numYTiles () - 1);
            }

            modifyDeepChannels<uint32_t> (sampleCount, intChannels, 1);
            modifyDeepChannels<half> (sampleCount, halfChannels, 0.3);
            modifyDeepChannels<float> (sampleCount, floatChannels, 0.5);

            if (type == DEEPSCANLINE)
            {
                Box2i                  dataWindow = header.dataWindow ();
                DeepScanLineOutputPart outputPart (outputFile, i);
                outputPart.setFrameBuffer (frameBuffer);
                outputPart.writePixels (
                    dataWindow.max.y - dataWindow.min.y + 1);
            }
            else
            {
                DeepTiledOutputPart outputPart (outputFile, i);
                outputPart.setFrameBuffer (frameBuffer);
                outputPart.writeTiles (
                    0,
                    outputPart.numXTiles () - 1,
                    0,
                    outputPart.numYTiles () - 1);
            }

            freeDeepBuffers (intChannels);
            freeDeepBuffers (halfChannels);
            freeDeepBuffers (floatChannels);
        }
    }
}